

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMap.hpp
# Opt level: O3

int __thiscall
MultiMap<long,_Server::Private::TimerImpl_*>::remove
          (MultiMap<long,_Server::Private::TimerImpl_*> *this,char *__filename)

{
  Item *pIVar1;
  Item *pIVar2;
  usize uVar3;
  code *pcVar4;
  int iVar5;
  Item *pIVar6;
  Item *pIVar7;
  Item *pIVar8;
  Iterator *pIVar9;
  Item *pIVar10;
  Item **ppIVar11;
  Item *pIVar12;
  
  pIVar1 = *(Item **)__filename;
  pIVar7 = pIVar1->parent;
  if (pIVar7 == (Item *)0x0) {
    ppIVar11 = &this->root;
  }
  else {
    ppIVar11 = &pIVar7->right;
    if (pIVar1 == pIVar7->left) {
      ppIVar11 = &pIVar7->left;
    }
  }
  if ((*ppIVar11 != pIVar1) &&
     (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                            ,0xb3,"*cell == item"), iVar5 != 0)) goto LAB_0010f3d6;
  pIVar6 = pIVar1->left;
  pIVar10 = pIVar1->right;
  pIVar12 = pIVar7;
  if (pIVar6 == (Item *)0x0 && pIVar10 == (Item *)0x0) {
    *ppIVar11 = (Item *)0x0;
  }
  else if (pIVar6 == (Item *)0x0) {
    *ppIVar11 = pIVar10;
    pIVar10->parent = pIVar7;
  }
  else if (pIVar10 == (Item *)0x0) {
    *ppIVar11 = pIVar6;
    pIVar6->parent = pIVar7;
  }
  else {
    if (pIVar6->height < pIVar10->height) {
      pIVar8 = pIVar1->next;
      if ((pIVar8->left != (Item *)0x0) &&
         (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                ,0xce,"!next->left"), iVar5 != 0)) {
LAB_0010f3d6:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      pIVar12 = pIVar8->parent;
      if (pIVar12 == pIVar1) {
        if ((pIVar8 != pIVar10) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                  ,0xd2,"next == right"), iVar5 != 0)) goto LAB_0010f3d6;
        *ppIVar11 = pIVar8;
        pIVar8->parent = pIVar7;
        pIVar8->left = pIVar6;
        pIVar10 = pIVar6;
        pIVar12 = pIVar8;
      }
      else {
        if ((pIVar8 != pIVar12->left) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                  ,0xdd,"next == nextParent->left"), iVar5 != 0)) goto LAB_0010f3d6;
        pIVar2 = pIVar8->right;
        pIVar12->left = pIVar2;
        if (pIVar2 != (Item *)0x0) {
          pIVar2->parent = pIVar12;
        }
        *ppIVar11 = pIVar8;
        pIVar8->parent = pIVar7;
        pIVar8->left = pIVar6;
        pIVar6->parent = pIVar8;
        pIVar8->right = pIVar10;
      }
    }
    else {
      pIVar8 = pIVar1->prev;
      if ((pIVar8->right != (Item *)0x0) &&
         (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                ,0xf7,"!prev->right"), iVar5 != 0)) goto LAB_0010f3d6;
      pIVar12 = pIVar8->parent;
      if (pIVar12 == pIVar1) {
        if ((pIVar8 != pIVar6) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                  ,0xfb,"prev == left"), iVar5 != 0)) goto LAB_0010f3d6;
        *ppIVar11 = pIVar8;
        pIVar8->parent = pIVar7;
        pIVar8->right = pIVar10;
        pIVar12 = pIVar8;
      }
      else {
        if ((pIVar8 != pIVar12->right) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                  ,0x106,"prev == prevParent->right"), iVar5 != 0))
        goto LAB_0010f3d6;
        pIVar2 = pIVar8->left;
        pIVar12->right = pIVar2;
        if (pIVar2 != (Item *)0x0) {
          pIVar2->parent = pIVar12;
        }
        *ppIVar11 = pIVar8;
        pIVar8->parent = pIVar7;
        pIVar8->right = pIVar10;
        pIVar10->parent = pIVar8;
        pIVar8->left = pIVar6;
        pIVar10 = pIVar6;
      }
    }
    pIVar10->parent = pIVar8;
    do {
      uVar3 = pIVar12->height;
      Item::updateHeightAndSlope(pIVar12);
      pIVar6 = rebal(this,pIVar12);
      if (uVar3 == pIVar6->height) {
        pIVar7 = *ppIVar11;
        Item::updateHeightAndSlope(pIVar7);
        pIVar7 = rebal(this,pIVar7);
        goto LAB_0010f3fa;
      }
      pIVar12 = pIVar6->parent;
    } while (pIVar12 != pIVar7);
  }
  while (pIVar12 != (Item *)0x0) {
    uVar3 = pIVar12->height;
    Item::updateHeightAndSlope(pIVar12);
    pIVar7 = rebal(this,pIVar12);
    if (uVar3 == pIVar7->height) break;
LAB_0010f3fa:
    pIVar12 = pIVar7->parent;
  }
  pIVar7 = pIVar1->next;
  pIVar6 = pIVar1->prev;
  pIVar9 = (Iterator *)&pIVar6->next;
  if (pIVar6 == (Item *)0x0) {
    pIVar9 = &this->_begin;
  }
  pIVar9->item = pIVar7;
  pIVar7->prev = pIVar6;
  this->_size = this->_size - 1;
  pIVar1->prev = this->freeItem;
  this->freeItem = pIVar1;
  return (int)pIVar7;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;
    Item* origParent;
    Item* parent = origParent = item->parent;
    Item** cell = parent ? (item == parent->left ? &parent->left : &parent->right) : &root;
    ASSERT(*cell == item);
    Item* left = item->left;
    Item* right = item->right;

    if(!left && !right)
    {
      *cell = 0;
      goto rebalParentUpwards;
    }

    if(!left)
    {
      *cell = right;
      right->parent = parent;
      goto rebalParentUpwards;
    }

    if(!right)
    {
      *cell = left;
      left->parent = parent;
      goto rebalParentUpwards;
    }

    if(left->height < right->height)
    {
      Item* next = item->next;
      ASSERT(!next->left);
      Item* nextParent = next->parent;
      if(nextParent == item)
      {
        ASSERT(next == right);
        *cell = next;
        next->parent = parent;

        next->left = left;
        left->parent = next;
        parent = next;
        goto rebalParent;
      }

      // unlink next
      ASSERT(next == nextParent->left);
      Item* nextRight = next->right;
      nextParent->left = nextRight;
      if(nextRight)
        nextRight->parent = nextParent;
      
      // put next in cell
      *cell = next;
      next->parent = parent;

      // link left to next left
      next->left = left;
      left->parent = next;

      // link right to next right
      next->right = right;
      right->parent = next;

      // rebal old next->parent
      parent = nextParent;
      ASSERT(parent);
      goto rebalParent;
    }
    else
    {
      Item* prev = item->prev;
      ASSERT(!prev->right);
      Item* prevParent = prev->parent;
      if(prevParent == item)
      {
        ASSERT(prev == left);
        *cell = prev;
        prev->parent = parent;

        prev->right = right;
        right->parent = prev;
        parent = prev;
        goto rebalParent;
      }

      // unlink prev
      ASSERT(prev == prevParent->right);
      Item* prevLeft = prev->left;
      prevParent->right = prevLeft;
      if(prevLeft)
        prevLeft->parent = prevParent;

      // put prev in cell
      *cell = prev;
      prev->parent = parent;

      // link right to prev right
      prev->right = right;
      right->parent = prev;

      // link left to prev left
      prev->left = left;
      left->parent = prev;

      // rebal old prev->parent
      parent = prevParent;
      ASSERT(parent);
      goto rebalParent;
    }

    // rebal parent upwards
  rebalParent:
    do
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
      {
        parent = *cell;
        parent->updateHeightAndSlope();
        parent = rebal(parent);
        parent = parent->parent;
        break;
      }
      parent = parent->parent;
    } while(parent != origParent);
  rebalParentUpwards:
    while(parent)
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
        break;
      parent = parent->parent;
    }

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;
    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }